

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O0

void __thiscall
mahjong::PatternComputer::setHighest
          (PatternComputer *this,WiningHand *hand,WiningPatterns *patterns)

{
  Pattern PVar1;
  size_t this_00;
  bool bVar2;
  reference pPVar3;
  reference pPVar4;
  pair<std::_Rb_tree_const_iterator<mahjong::Pattern>,_bool> pVar5;
  undefined1 local_a0 [16];
  _Base_ptr local_90;
  undefined1 local_88;
  IsLimitHand local_6d;
  Pattern local_6c;
  iterator iStack_68;
  Pattern it;
  iterator __end1;
  iterator __begin1;
  WiningPatterns *__range1;
  WiningPatterns final_patterns;
  WiningPatterns *patterns_local;
  WiningHand *hand_local;
  PatternComputer *this_local;
  
  final_patterns._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)patterns;
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
            ((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
              *)&__range1);
  this_00 = final_patterns._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::
           set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
           begin((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                  *)final_patterns._M_t._M_impl.super__Rb_tree_header._M_node_count);
  iStack_68 = std::
              set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
              ::end((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                     *)this_00);
  while (bVar2 = std::operator!=(&__end1,&stack0xffffffffffffff98), bVar2) {
    pPVar3 = std::_Rb_tree_const_iterator<mahjong::Pattern>::operator*(&__end1);
    local_6c = *pPVar3;
    bVar2 = IsLimitHand::operator()(&local_6d,&local_6c);
    if (bVar2) {
      pVar5 = std::
              set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
              ::insert((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                        *)&__range1,&local_6c);
      local_90 = (_Base_ptr)pVar5.first._M_node;
      local_88 = pVar5.second;
    }
    std::_Rb_tree_const_iterator<mahjong::Pattern>::operator++(&__end1);
  }
  bVar2 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::empty((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&__range1);
  if (bVar2) {
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    operator=((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
               *)&__range1,
              (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
               *)final_patterns._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  bVar2 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::empty(&this->highest_patterns);
  if (bVar2) {
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    operator=(&this->highest_patterns,
              (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
               *)&__range1);
    WiningHand::operator=(&this->highest_wining_hand,hand);
  }
  else {
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    rbegin((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
           (local_a0 + 8));
    pPVar4 = std::reverse_iterator<std::_Rb_tree_const_iterator<mahjong::Pattern>_>::operator*
                       ((reverse_iterator<std::_Rb_tree_const_iterator<mahjong::Pattern>_> *)
                        (local_a0 + 8));
    PVar1 = *pPVar4;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    rbegin((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
           local_a0);
    pPVar4 = std::reverse_iterator<std::_Rb_tree_const_iterator<mahjong::Pattern>_>::operator*
                       ((reverse_iterator<std::_Rb_tree_const_iterator<mahjong::Pattern>_> *)
                        local_a0);
    if ((int)PVar1 < (int)*pPVar4) {
      std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
      operator=(&this->highest_patterns,
                (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                 *)&__range1);
      WiningHand::operator=(&this->highest_wining_hand,hand);
    }
  }
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::~set
            ((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
              *)&__range1);
  return;
}

Assistant:

void PatternComputer::setHighest(const WiningHand& hand, const WiningPatterns& patterns)
{
	// limit hands can combine only themselves.
	WiningPatterns final_patterns;
	for (auto it : patterns)
	{
		if (IsLimitHand()(it))
		{
			final_patterns.insert(it);
		}
	}
	if (final_patterns.empty())
	{
		final_patterns = patterns;
	}

	// choose highest
	if (highest_patterns.empty())
	{
		highest_patterns = final_patterns;
		highest_wining_hand = hand;
	}
	else if ((int)*highest_patterns.rbegin() < (int)*final_patterns.rbegin())
	{
		highest_patterns = final_patterns;
		highest_wining_hand = hand;
	}
}